

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_21a7766::Parser::State::State
          (State *this,uint32_t *words_arg,size_t num_words_arg,spv_diagnostic *diagnostic_arg)

{
  spv_diagnostic *diagnostic_arg_local;
  size_t num_words_arg_local;
  uint32_t *words_arg_local;
  State *this_local;
  
  this->words = words_arg;
  this->num_words = num_words_arg;
  this->diagnostic = diagnostic_arg;
  this->word_index = 0;
  this->instruction_count = 0;
  this->endian = SPV_ENDIANNESS_LITTLE;
  this->requires_endian_conversion = false;
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->id_to_type_id);
  std::
  unordered_map<unsigned_int,_(anonymous_namespace)::Parser::NumberType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>_>
  ::unordered_map(&this->type_id_to_number_type_info);
  std::
  unordered_map<unsigned_int,_spv_ext_inst_type_t,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>_>
  ::unordered_map(&this->import_id_to_ext_inst_type);
  std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::vector(&this->operands);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->endian_converted_words);
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::vector
            (&this->expected_operands);
  std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::reserve
            (&this->operands,0x19);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->endian_converted_words,0x19);
  std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::reserve
            (&this->expected_operands,0x19);
  return;
}

Assistant:

State(const uint32_t* words_arg, size_t num_words_arg,
          spv_diagnostic* diagnostic_arg)
        : words(words_arg),
          num_words(num_words_arg),
          diagnostic(diagnostic_arg),
          word_index(0),
          instruction_count(0),
          endian(),
          requires_endian_conversion(false) {
      // Temporary storage for parser state within a single instruction.
      // Most instructions require fewer than 25 words or operands.
      operands.reserve(25);
      endian_converted_words.reserve(25);
      expected_operands.reserve(25);
    }